

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

int __thiscall
DeviceTy::deallocTgtPtr(DeviceTy *this,void *HstPtrBegin,int64_t Size,bool ForceDelete)

{
  _List_node_base *p_Var1;
  const_iterator __position;
  int iVar2;
  LookupResult LVar3;
  
  std::mutex::lock(&this->DataMapMtx);
  LVar3 = lookupMapping(this,HstPtrBegin,Size);
  __position._M_node = (_List_node_base *)LVar3.Entry._M_node;
  if (((undefined1  [16])LVar3 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    iVar2 = -1;
  }
  else {
    if (ForceDelete) {
      __position._M_node[3]._M_next = (_List_node_base *)0x0;
    }
    else {
      p_Var1 = __position._M_node[3]._M_next;
      __position._M_node[3]._M_next = (_List_node_base *)((long)&p_Var1[-1]._M_prev + 7);
      iVar2 = 0;
      if (1 < (long)p_Var1) goto LAB_001030ec;
    }
    (*this->RTL->data_delete)(this->RTLDeviceID,__position._M_node[2]._M_prev);
    std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::erase
              (&this->HostDataToTargetMap,__position);
    iVar2 = 0;
  }
LAB_001030ec:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return iVar2;
}

Assistant:

int DeviceTy::deallocTgtPtr(void *HstPtrBegin, int64_t Size, bool ForceDelete) {
  // Check if the pointer is contained in any sub-nodes.
  int rc;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);
  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    if (ForceDelete)
      HT.RefCount = 1;
    if (--HT.RefCount <= 0) {
      assert(HT.RefCount == 0 && "did not expect a negative ref count");
      DP("Deleting tgt data " DPxMOD " of size %ld\n",
          DPxPTR(HT.TgtPtrBegin), Size);
      RTL->data_delete(RTLDeviceID, (void *)HT.TgtPtrBegin);
      DP("Removing%s mapping with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD
          ", Size=%ld\n", (ForceDelete ? " (forced)" : ""),
          DPxPTR(HT.HstPtrBegin), DPxPTR(HT.TgtPtrBegin), Size);
      HostDataToTargetMap.erase(lr.Entry);
    }
    rc = OFFLOAD_SUCCESS;
  } else {
    DP("Section to delete (hst addr " DPxMOD ") does not exist in the allocated"
       " memory\n", DPxPTR(HstPtrBegin));
    rc = OFFLOAD_FAIL;
  }

  DataMapMtx.unlock();
  return rc;
}